

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::TextureUnitCase::init(TextureUnitCase *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppTVar1;
  vector<int,_std::allocator<int>_> *this_00;
  ContextInfo *pCVar2;
  iterator __position;
  iterator __position_00;
  iterator iVar3;
  pointer pPVar4;
  bool bVar5;
  char *pcVar6;
  int iVar7;
  deUint32 dVar8;
  deBool dVar9;
  deUint32 dVar10;
  uint uVar11;
  int extraout_EAX;
  int extraout_EAX_00;
  long *plVar12;
  undefined8 *puVar13;
  size_t sVar14;
  TextureCube *pTVar15;
  pointer *pppTVar16;
  _Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *p_Var17;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last;
  MultiTexShader *this_01;
  long *plVar18;
  ulong *puVar19;
  long lVar20;
  uint *__args;
  int levelNdx;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first;
  uint uVar24;
  long lVar25;
  uint uVar26;
  bool bVar27;
  float fVar28;
  Random rnd;
  TextureParameters params;
  GLenum type;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> unitTypes;
  PixelBufferAccess access;
  deRandom local_470;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  long lStack_448;
  pointer *local_440;
  pointer *local_438;
  uint local_430;
  undefined4 uStack_42c;
  long local_428;
  ulong local_420 [2];
  RGBA local_410;
  RGBA local_40c;
  Vec4 local_408;
  long local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  ulong local_3d8;
  long lStack_3d0;
  vector<int,_std::allocator<int>_> *local_3c0;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_3b8;
  ulong local_3b0;
  Vec4 local_3a8;
  long local_398;
  long lStack_390;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  long local_378 [2];
  vector<deqp::gles2::Functional::TextureUnitCase::TextureParameters,std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>>
  *local_368;
  vector<tcu::Texture2D*,std::allocator<tcu::Texture2D*>> *local_360;
  vector<tcu::TextureCube*,std::allocator<tcu::TextureCube*>> *local_358;
  ulong local_350;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  undefined8 uStack_320;
  undefined8 local_318;
  float fStack_310;
  float fStack_30c;
  ios_base local_2b0 [264];
  PixelBufferAccess local_1a8 [2];
  ios_base local_138 [264];
  
  iVar7 = this->m_numUnitsParam;
  if (iVar7 < 1) {
    pCVar2 = ((this->super_TestCase).m_context)->m_contextInfo;
    iVar7 = (*pCVar2->_vptr_ContextInfo[2])(pCVar2,0x8872);
  }
  this->m_numUnits = iVar7;
  pTVar15 = (TextureCube *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  deRandom_init(&local_470,this->m_randSeed);
  fVar28 = deRandom_getFloat(&local_470);
  iVar7 = this->m_numUnits;
  if (0.7 <= fVar28) {
    dVar8 = deRandom_getUint32(&local_470);
    iVar23 = 1;
    if (1 < iVar7 + -2) {
      iVar23 = iVar7 + -2;
    }
    iVar7 = dVar8 % ((iVar7 - iVar23) + 1U) + iVar23;
  }
  this->m_numTextures = iVar7;
  local_328 = (undefined1  [8])pTVar15;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,this->m_numUnits);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_388,0,(char *)0x0,0x6424c1);
  plVar18 = plVar12 + 2;
  if ((long *)*plVar12 == plVar18) {
    local_398 = *plVar18;
    lStack_390 = plVar12[3];
    local_3a8.m_data._0_8_ = &local_398;
  }
  else {
    local_398 = *plVar18;
    local_3a8.m_data._0_8_ = (long *)*plVar12;
  }
  local_3a8.m_data._8_8_ = plVar12[1];
  *plVar12 = (long)plVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_3a8);
  puVar19 = (ulong *)(plVar12 + 2);
  if ((ulong *)*plVar12 == puVar19) {
    local_3d8 = *puVar19;
    lStack_3d0 = plVar12[3];
    local_3e8 = &local_3d8;
  }
  else {
    local_3d8 = *puVar19;
    local_3e8 = (ulong *)*plVar12;
  }
  uStack_3e0 = plVar12[1];
  *plVar12 = (long)puVar19;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,this->m_numTextures);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar22 = 0xf;
  if (local_3e8 != &local_3d8) {
    uVar22 = local_3d8;
  }
  if (uVar22 < (ulong)(local_428 + uStack_3e0)) {
    uVar22 = 0xf;
    if ((ulong *)CONCAT44(uStack_42c,local_430) != local_420) {
      uVar22 = local_420[0];
    }
    if ((ulong)(local_428 + uStack_3e0) <= uVar22) {
      puVar13 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_430,0,(char *)0x0,(ulong)local_3e8);
      goto LAB_00367ce5;
    }
  }
  puVar13 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_3e8,CONCAT44(uStack_42c,local_430));
LAB_00367ce5:
  local_408.m_data._0_8_ = &local_3f8;
  plVar12 = puVar13 + 2;
  if ((long *)*puVar13 == plVar12) {
    local_3f8 = *plVar12;
    uStack_3f0 = puVar13[3];
  }
  else {
    local_3f8 = *plVar12;
    local_408.m_data._0_8_ = (long *)*puVar13;
  }
  local_408.m_data._8_8_ = puVar13[1];
  *puVar13 = plVar12;
  puVar13[1] = 0;
  *(undefined1 *)plVar12 = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_408);
  plVar18 = plVar12 + 2;
  if ((long *)*plVar12 == plVar18) {
    local_450 = *plVar18;
    lStack_448 = plVar12[3];
    local_460 = &local_450;
  }
  else {
    local_450 = *plVar18;
    local_460 = (long *)*plVar12;
  }
  pcVar6 = (char *)local_460;
  uStack_458 = plVar12[1];
  *plVar12 = (long)plVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  if (local_460 == (long *)0x0) {
    std::ios::clear((int)(ostringstream *)&uStack_320 + (int)*(undefined8 *)(uStack_320 + -6));
  }
  else {
    sVar14 = strlen((char *)local_460);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_320,pcVar6,sVar14);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_328,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  if ((long *)local_408.m_data._0_8_ != &local_3f8) {
    operator_delete((void *)local_408.m_data._0_8_,local_3f8 + 1);
  }
  if ((ulong *)CONCAT44(uStack_42c,local_430) != local_420) {
    operator_delete((ulong *)CONCAT44(uStack_42c,local_430),local_420[0] + 1);
  }
  if (local_3e8 != &local_3d8) {
    operator_delete(local_3e8,local_3d8 + 1);
  }
  if ((long *)local_3a8.m_data._0_8_ != &local_398) {
    operator_delete((void *)local_3a8.m_data._0_8_,local_398 + 1);
  }
  if ((long *)CONCAT44(fStack_384,local_388) != local_378) {
    operator_delete((long *)CONCAT44(fStack_384,local_388),local_378[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_320);
  std::ios_base::~ios_base(local_2b0);
  local_3b8 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_textureTypes;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_3b8,
             (long)this->m_numTextures);
  local_368 = (vector<deqp::gles2::Functional::TextureUnitCase::TextureParameters,std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>>
               *)&this->m_textureParams;
  std::
  vector<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
  ::reserve((vector<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
             *)local_368,(long)this->m_numTextures);
  local_3c0 = &this->m_ndx2dOrCube;
  std::vector<int,_std::allocator<int>_>::reserve(local_3c0,(long)this->m_numTextures);
  if (0 < this->m_numTextures) {
    local_358 = (vector<tcu::TextureCube*,std::allocator<tcu::TextureCube*>> *)&this->m_texturesCube
    ;
    local_438 = &(this->m_texturesCube).
                 super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>._M_impl
                 .super__Vector_impl_data._M_finish;
    local_360 = (vector<tcu::Texture2D*,std::allocator<tcu::Texture2D*>> *)&this->m_textures2d;
    local_440 = (pointer *)
                &(this->m_textures2d).
                 super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    local_3b0 = 0;
    do {
      if (this->m_caseType == CASE_ONLY_CUBE) {
LAB_00367f90:
        local_430 = 0x8513;
        uVar11 = 0x100;
        bVar5 = false;
      }
      else {
        if (this->m_caseType != CASE_ONLY_2D) {
          dVar9 = deRandom_getBool(&local_470);
          if (dVar9 != 1) goto LAB_00367f90;
        }
        local_430 = 0xde1;
        uVar11 = 0x80;
        bVar5 = true;
      }
      dVar8 = deRandom_getUint32(&local_470);
      uStack_458._0_4_ = *(GLenum *)(s_testWrapModes + (ulong)(dVar8 % 3) * 4);
      dVar8 = deRandom_getUint32(&local_470);
      uStack_458 = CONCAT44(*(undefined4 *)(s_testWrapModes + (ulong)(dVar8 % 3) * 4),
                            (GLenum)uStack_458);
      dVar8 = deRandom_getUint32(&local_470);
      local_450._4_4_ = (&s_testMagFilters)[dVar8 & 1];
      dVar8 = deRandom_getUint32(&local_470);
      local_460._4_4_ = *(GLenum *)(s_testDataTypes + (ulong)(dVar8 & 3) * 4);
      dVar8 = deRandom_getUint32(&local_470);
      local_450 = CONCAT44(local_450._4_4_,
                           *(undefined4 *)(s_testMinFilters + (ulong)(dVar8 % 6) * 4));
      if (local_460._4_4_ == 0x8363) {
        local_460 = (long *)0x836300001907;
      }
      else if (local_460._4_4_ - 0x8033 < 2) {
        local_460 = (long *)CONCAT44(local_460._4_4_,0x1908);
      }
      else {
        dVar8 = deRandom_getUint32(&local_470);
        local_460 = (long *)CONCAT44(local_460._4_4_,
                                     *(undefined4 *)(s_testFormats + (ulong)(dVar8 % 5) * 4));
      }
      __position._M_current =
           (this->m_textureTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_textureTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(local_3b8,__position,&local_430);
      }
      else {
        *__position._M_current = local_430;
        (this->m_textureTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      __position_00._M_current =
           (this->m_textureParams).
           super__Vector_base<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->m_textureParams).
          super__Vector_base<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<deqp::gles2::Functional::TextureUnitCase::TextureParameters,std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>>
        ::_M_realloc_insert<deqp::gles2::Functional::TextureUnitCase::TextureParameters_const&>
                  (local_368,__position_00,(TextureParameters *)&local_460);
      }
      else {
        (__position_00._M_current)->minFilter = (GLenum)local_450;
        (__position_00._M_current)->magFilter = local_450._4_4_;
        *(long **)__position_00._M_current = local_460;
        (__position_00._M_current)->wrapModeS = (GLenum)uStack_458;
        (__position_00._M_current)->wrapModeT = uStack_458._4_4_;
        ppTVar1 = &(this->m_textureParams).
                   super__Vector_base<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppTVar1 = *ppTVar1 + 1;
      }
      if (bVar5) {
        local_328._0_4_ =
             (undefined4)
             ((ulong)((long)(this->m_textures2d).
                            super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_textures2d).
                           super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3);
        iVar3._M_current =
             (this->m_ndx2dOrCube).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->m_ndx2dOrCube).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_3c0,iVar3,(int *)local_328);
        }
        else {
          *iVar3._M_current = local_328._0_4_;
          (this->m_ndx2dOrCube).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        pTVar15 = (TextureCube *)operator_new(0x50);
        local_1a8[0].super_ConstPixelBufferAccess.m_format =
             glu::mapGLTransferFormat((GLenum)local_460,local_460._4_4_);
        tcu::Texture2D::Texture2D((Texture2D *)pTVar15,(TextureFormat *)local_1a8,uVar11,uVar11);
        local_328 = (undefined1  [8])pTVar15;
        std::vector<tcu::Texture2D*,std::allocator<tcu::Texture2D*>>::emplace_back<tcu::Texture2D*>
                  (local_360,(Texture2D **)local_328);
        pppTVar16 = local_440;
      }
      else {
        local_328._0_4_ =
             (undefined4)
             ((ulong)((long)(this->m_texturesCube).
                            super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_texturesCube).
                           super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3);
        iVar3._M_current =
             (this->m_ndx2dOrCube).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->m_ndx2dOrCube).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_3c0,iVar3,(int *)local_328);
        }
        else {
          *iVar3._M_current = local_328._0_4_;
          (this->m_ndx2dOrCube).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        pTVar15 = (TextureCube *)operator_new(0x168);
        local_1a8[0].super_ConstPixelBufferAccess.m_format =
             glu::mapGLTransferFormat((GLenum)local_460,local_460._4_4_);
        tcu::TextureCube::TextureCube(pTVar15,(TextureFormat *)local_1a8,uVar11);
        local_328 = (undefined1  [8])pTVar15;
        std::vector<tcu::TextureCube*,std::allocator<tcu::TextureCube*>>::
        emplace_back<tcu::TextureCube*>(local_358,(TextureCube **)local_328);
        pppTVar16 = local_438;
      }
      tcu::getTextureFormatInfo((TextureFormatInfo *)local_328,&(*pppTVar16)[-1]->m_format);
      iVar7 = 0;
      if (uVar11 != 0) {
        for (; (uVar11 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
        }
      }
      local_338 = (float)local_328._0_4_;
      fStack_334 = (float)local_328._4_4_;
      fStack_330 = (float)uStack_320;
      fStack_32c = uStack_320._4_4_;
      local_348 = (float)local_318 - (float)local_328._0_4_;
      fStack_344 = local_318._4_4_ - (float)local_328._4_4_;
      fStack_340 = fStack_310 - (float)uStack_320;
      fStack_33c = fStack_30c - uStack_320._4_4_;
      local_350 = (ulong)(iVar7 + 1);
      uVar22 = 0;
      do {
        dVar8 = deRandom_getUint32(&local_470);
        uVar24 = 0xff000000;
        uVar11 = 0xff000000;
        if ((GLenum)local_460 == 0x1906) {
          dVar10 = deRandom_getUint32(&local_470);
          uVar24 = dVar10 & 0xff000000;
          uVar11 = ~uVar24;
        }
        lVar25 = 0;
        uVar21 = 0;
        do {
          if (bVar5) {
            tcu::Texture2D::allocLevel((Texture2D *)(*local_440)[-1],(int)uVar21);
            uVar26 = 8 >> ((byte)uVar21 & 0x1f);
            iVar7 = uVar26 + (uVar26 == 0);
            p_Var17 = (_Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       *)&(*local_440)[-1]->m_data[0].
                          super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          else {
            tcu::TextureCube::allocLevel((*local_438)[-1],(CubeFace)uVar22,(int)uVar21);
            uVar26 = 8 >> ((byte)uVar21 & 0x1f);
            iVar7 = uVar26 + (uVar26 == 0);
            p_Var17 = &(*local_438)[-1]->m_access[uVar22].
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
            ;
          }
          pPVar4 = (p_Var17->_M_impl).super__Vector_impl_data._M_start;
          local_1a8[0].super_ConstPixelBufferAccess.m_format = *(TextureFormat *)(pPVar4 + uVar21);
          lVar20 = 2;
          do {
            local_1a8[0].super_ConstPixelBufferAccess.m_size.m_data[lVar20 + -2] =
                 *(int *)((long)(pPVar4->super_ConstPixelBufferAccess).m_size.m_data +
                         lVar20 * 4 + lVar25 + -8);
            lVar20 = lVar20 + 1;
          } while (lVar20 != 5);
          lVar20 = 5;
          do {
            local_1a8[0].super_ConstPixelBufferAccess.m_size.m_data[lVar20 + -2] =
                 *(int *)((long)(pPVar4->super_ConstPixelBufferAccess).m_size.m_data +
                         lVar20 * 4 + lVar25 + -8);
            lVar20 = lVar20 + 1;
          } while (lVar20 != 8);
          local_1a8[0].super_ConstPixelBufferAccess.m_data =
               *(void **)((TextureFormat *)(pPVar4 + uVar21) + 4);
          local_40c.m_value = uVar24 | dVar8 & 0xffffff;
          tcu::RGBA::toVec(&local_40c);
          local_408.m_data[1] = local_3e8._4_4_ * fStack_344 + fStack_334;
          local_408.m_data[0] = (float)local_3e8 * local_348 + local_338;
          local_408.m_data[3] = uStack_3e0._4_4_ * fStack_33c + fStack_32c;
          local_408.m_data[2] = (float)uStack_3e0 * fStack_340 + fStack_330;
          local_410.m_value = ~(dVar8 & 0xffffff) | uVar11;
          tcu::RGBA::toVec(&local_410);
          local_3a8.m_data[1] = fStack_384 * fStack_344 + fStack_334;
          local_3a8.m_data[0] = local_388 * local_348 + local_338;
          local_3a8.m_data[3] = fStack_37c * fStack_33c + fStack_32c;
          local_3a8.m_data[2] = fStack_380 * fStack_340 + fStack_330;
          tcu::fillWithGrid(local_1a8,iVar7,&local_408,&local_3a8);
          uVar21 = uVar21 + 1;
          lVar25 = lVar25 + 0x28;
        } while (uVar21 != local_350);
        bVar27 = uVar22 < 5;
        uVar22 = uVar22 + 1;
      } while (bVar27 && !bVar5);
      uVar11 = (int)local_3b0 + 1;
      local_3b0 = (ulong)uVar11;
    } while ((int)uVar11 < this->m_numTextures);
  }
  this_00 = &this->m_unitTextures;
  std::vector<int,_std::allocator<int>_>::reserve(this_00,(long)this->m_numUnits);
  local_328 = (undefined1  [8])((ulong)local_328 & 0xffffffff00000000);
  if (0 < this->m_numTextures) {
    iVar7 = 0;
    do {
      iVar3._M_current =
           (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)this_00,iVar3,(int *)local_328);
      }
      else {
        *iVar3._M_current = iVar7;
        (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      iVar7 = local_328._0_4_ + 1;
      local_328._0_4_ = iVar7;
    } while (iVar7 < this->m_numTextures);
  }
  last._M_current =
       (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  first._M_current =
       (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)last._M_current - (long)first._M_current) >> 2) < this->m_numUnits) {
    do {
      uVar11 = this->m_numTextures;
      dVar8 = deRandom_getUint32(&local_470);
      uVar11 = dVar8 % uVar11;
      local_328._0_4_ = uVar11;
      iVar3._M_current =
           (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (this_00,iVar3,(int *)local_328);
        last._M_current =
             (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
      }
      else {
        *iVar3._M_current = uVar11;
        last._M_current = iVar3._M_current + 1;
        (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = last._M_current;
      }
      first._M_current =
           (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
    } while ((int)((ulong)((long)last._M_current - (long)first._M_current) >> 2) < this->m_numUnits)
    ;
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((Random *)&local_470,first,last);
  local_328 = (undefined1  [8])0x0;
  uStack_320 = (uint *)0x0;
  local_318 = (uint *)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_328,(long)this->m_numUnits
            );
  if (0 < this->m_numUnits) {
    lVar25 = 0;
    do {
      __args = (uint *)((long)(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start[lVar25] * 4 + *(long *)local_3b8);
      if (uStack_320 == local_318) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_328,uStack_320,__args)
        ;
      }
      else {
        *uStack_320 = *__args;
        uStack_320 = uStack_320 + 1;
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 < this->m_numUnits);
  }
  this_01 = (MultiTexShader *)operator_new(0x1a0);
  dVar8 = deRandom_getUint32(&local_470);
  MultiTexShader::MultiTexShader
            (this_01,dVar8,this->m_numUnits,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_328);
  this->m_shader = this_01;
  iVar7 = extraout_EAX;
  if (local_328 != (undefined1  [8])0x0) {
    operator_delete((void *)local_328,(long)local_318 - (long)local_328);
    iVar7 = extraout_EAX_00;
  }
  return iVar7;
}

Assistant:

void TextureUnitCase::init (void)
{
	m_numUnits = m_numUnitsParam > 0 ? m_numUnitsParam : m_context.getContextInfo().getInt(GL_MAX_TEXTURE_IMAGE_UNITS);

	// Make the textures.

	try
	{
		tcu::TestLog&	log	= m_testCtx.getLog();
		de::Random		rnd	(m_randSeed);

		if (rnd.getFloat() < 0.7f)
			m_numTextures = m_numUnits;											// In most cases use one unit per texture.
		else
			m_numTextures = rnd.getInt(deMax32(1, m_numUnits - 2), m_numUnits);	// Sometimes assign same texture to multiple units.

		log << tcu::TestLog::Message << ("Using " + de::toString(m_numUnits) + " texture unit(s) and " + de::toString(m_numTextures) + " texture(s)").c_str() << tcu::TestLog::EndMessage;

		m_textureTypes.reserve(m_numTextures);
		m_textureParams.reserve(m_numTextures);
		m_ndx2dOrCube.reserve(m_numTextures);

		// Generate textures.

		for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
		{
			// Either fixed or randomized target types (2d or cube), and randomized parameters for every texture.

			TextureParameters	params;
			bool				is2d		= m_caseType == CASE_ONLY_2D	? true :
											  m_caseType == CASE_ONLY_CUBE	? false :
																			  rnd.getBool();

			GLenum				type		= is2d ? GL_TEXTURE_2D : GL_TEXTURE_CUBE_MAP;
			const int			texWidth	= is2d ? TEXTURE_WIDTH_2D : TEXTURE_WIDTH_CUBE;
			const int			texHeight	= is2d ? TEXTURE_HEIGHT_2D : TEXTURE_HEIGHT_CUBE;
			bool				mipmaps		= (deIsPowerOfTwo32(texWidth) && deIsPowerOfTwo32(texHeight));
			int					numLevels	= mipmaps ? deLog2Floor32(de::max(texWidth, texHeight))+1 : 1;

			params.wrapModeS	= s_testWrapModes	[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testWrapModes) - 1)];
			params.wrapModeT	= s_testWrapModes	[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testWrapModes) - 1)];
			params.magFilter	= s_testMagFilters	[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testMagFilters) - 1)];
			params.dataType		= s_testDataTypes	[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testDataTypes) - 1)];

			// Certain minification filters are only used when using mipmaps.
			if (mipmaps)
				params.minFilter = s_testMinFilters[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testMinFilters) - 1)];
			else
				params.minFilter = s_testNonMipmapMinFilters[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testNonMipmapMinFilters) - 1)];

			// Format may depend on data type.
			if (params.dataType == GL_UNSIGNED_SHORT_5_6_5)
				params.format = GL_RGB;
			else if (params.dataType == GL_UNSIGNED_SHORT_4_4_4_4 || params.dataType == GL_UNSIGNED_SHORT_5_5_5_1)
				params.format = GL_RGBA;
			else
				params.format = s_testFormats[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testFormats) - 1)];

			m_textureTypes.push_back(type);
			m_textureParams.push_back(params);

			// Create new texture.

			if (is2d)
			{
				m_ndx2dOrCube.push_back((int)m_textures2d.size()); // Remember the index this texture has in the 2d array.
				m_textures2d.push_back(new tcu::Texture2D(glu::mapGLTransferFormat(params.format, params.dataType), texWidth, texHeight));
			}
			else
			{
				m_ndx2dOrCube.push_back((int)m_texturesCube.size()); // Remember the index this texture has in the cube array.
				DE_ASSERT(texWidth == texHeight);
				m_texturesCube.push_back(new tcu::TextureCube(glu::mapGLTransferFormat(params.format, params.dataType), texWidth));
			}

			tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(is2d ? m_textures2d.back()->getFormat() : m_texturesCube.back()->getFormat());
			Vec4					cBias		= fmtInfo.valueMin;
			Vec4					cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

			// Fill with grid texture.

			int numFaces = is2d ? 1 : (int)tcu::CUBEFACE_LAST;

			for (int face = 0; face < numFaces; face++)
			{
				deUint32 rgb	= rnd.getUint32() & 0x00ffffff;
				deUint32 alpha0	= 0xff000000;
				deUint32 alpha1	= 0xff000000;

				if (params.format == GL_ALPHA) // \note This needs alpha to be visible.
				{
					alpha0 &= rnd.getUint32();
					alpha1 = ~alpha0;
				}

				deUint32 colorA = alpha0 | rgb;
				deUint32 colorB = alpha1 | ~rgb;

				for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
				{
					if (is2d)
						m_textures2d.back()->allocLevel(levelNdx);
					else
						m_texturesCube.back()->allocLevel((tcu::CubeFace)face, levelNdx);

					int curCellSize = deMax32(1, GRID_CELL_SIZE >> levelNdx); // \note Scale grid cell size for mipmaps.

					tcu::PixelBufferAccess access = is2d ? m_textures2d.back()->getLevel(levelNdx) : m_texturesCube.back()->getLevelFace(levelNdx, (tcu::CubeFace)face);
					tcu::fillWithGrid(access, curCellSize, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
				}
			}
		}

		// Assign a texture index to each unit.

		m_unitTextures.reserve(m_numUnits);

		// \note Every texture is used at least once.
		for (int i = 0; i < m_numTextures; i++)
			m_unitTextures.push_back(i);

		// Assign a random texture to remaining units.
		while ((int)m_unitTextures.size() < m_numUnits)
			m_unitTextures.push_back(rnd.getInt(0, m_numTextures - 1));

		rnd.shuffle(m_unitTextures.begin(), m_unitTextures.end());

		// Create shader.

		vector<GLenum> unitTypes;
		unitTypes.reserve(m_numUnits);
		for (int i = 0; i < m_numUnits; i++)
			unitTypes.push_back(m_textureTypes[m_unitTextures[i]]);

		DE_ASSERT(m_shader == DE_NULL);
		m_shader = new MultiTexShader(rnd.getUint32(), m_numUnits, unitTypes);
	}
	catch (const std::exception&)
	{
		// Clean up to save memory.
		TextureUnitCase::deinit();
		throw;
	}
}